

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::SetEscapedValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value,
          TemplateModifier *escfn)

{
  TemplateString value_00;
  allocator local_89;
  pointer local_88;
  size_type sStack_80;
  undefined1 local_78;
  uint7 uStack_77;
  undefined8 uStack_70;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_89);
  TemplateModifier::operator()(&local_68,escfn,value.ptr_,value.length_,&local_48);
  local_88 = local_68._M_dataplus._M_p;
  sStack_80 = local_68._M_string_length;
  local_78 = 0;
  uStack_70 = 0;
  value_00.length_ = local_68._M_string_length;
  value_00.ptr_ = local_68._M_dataplus._M_p;
  value_00._16_8_ = (ulong)uStack_77 << 8;
  value_00.id_ = 0;
  SetValue(this,variable,value_00);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void TemplateDictionary::SetEscapedValue(TemplateString variable,
                                         TemplateString value,
                                         const TemplateModifier& escfn) {
  SetValue(variable, string(escfn(value.data(), value.size())));
}